

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_traits.hpp
# Opt level: O1

char ** __thiscall
boost::xpressive::
compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>::
eat_ws_<char_const*>
          (compiler_traits<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
           *this,char **begin,char *end)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  if ((((byte)this[0x211] & 0x20) != 0) && (pbVar4 = (byte *)*begin, pbVar4 != (byte *)end)) {
    uVar2 = *(ushort *)(this + 0x214);
    do {
      if ((ulong)*pbVar4 != 0x23) {
        if (uVar2 == 0) {
          return begin;
        }
        if ((*(ushort *)(this + (ulong)*pbVar4 * 2) & uVar2) == 0) {
          return begin;
        }
      }
      pbVar3 = pbVar4 + 1;
      *begin = (char *)pbVar3;
      if (*pbVar4 == 0x23) {
        do {
          pbVar4 = pbVar3;
          if (pbVar3 == (byte *)end) break;
          pbVar4 = pbVar3 + 1;
          *begin = (char *)pbVar4;
          bVar1 = *pbVar3;
          pbVar3 = pbVar4;
        } while (bVar1 != 10);
      }
      else {
        pbVar4 = pbVar3;
        if (pbVar3 != (byte *)end && uVar2 != 0) {
          do {
            pbVar4 = pbVar3;
            if ((*(ushort *)(this + (ulong)*pbVar3 * 2) & uVar2) == 0) break;
            pbVar3 = pbVar3 + 1;
            *begin = (char *)pbVar3;
            pbVar4 = pbVar3;
          } while (pbVar3 != (byte *)end);
        }
      }
    } while (pbVar4 != (byte *)end);
  }
  return begin;
}

Assistant:

FwdIter &eat_ws_(FwdIter &begin, FwdIter end)
    {
        if(0 != (regex_constants::ignore_white_space & this->flags()))
        {
            while(end != begin && (BOOST_XPR_CHAR_(char_type, '#') == *begin || this->is_space_(*begin)))
            {
                if(BOOST_XPR_CHAR_(char_type, '#') == *begin++)
                {
                    while(end != begin && BOOST_XPR_CHAR_(char_type, '\n') != *begin++) {}
                }
                else
                {
                    for(; end != begin && this->is_space_(*begin); ++begin) {}
                }
            }
        }

        return begin;
    }